

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvstore.cpp
# Opt level: O3

void __thiscall KVStore::compaction(KVStore *this,int level)

{
  _WordT *p_Var1;
  undefined8 *puVar2;
  value_type *pvVar3;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableCache_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableCache_*>_>_>
  *pmVar4;
  _Base_ptr p_Var5;
  ulong uVar6;
  mapped_type pSVar7;
  pointer ppVar8;
  uint64_t uVar9;
  uint64_t uVar10;
  uint64_t uVar11;
  string path;
  string path_00;
  undefined4 uVar12;
  pointer pbVar13;
  pointer ppVar14;
  pointer ppVar15;
  int iVar16;
  int iVar17;
  uint uVar18;
  undefined8 *puVar19;
  mapped_type *ppSVar20;
  long *plVar21;
  SSTableCache *pSVar22;
  const_iterator cVar23;
  uint uVar24;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableHeader>
  *ppVar25;
  ulong uVar26;
  pointer *pppVar27;
  ulong uVar28;
  uint uVar29;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *file;
  pointer pbVar30;
  pointer pbVar31;
  long lVar32;
  pointer pcVar33;
  size_type sVar34;
  __mode_t __mode;
  pointer pcVar35;
  undefined8 uVar36;
  _Alloc_hider _Var37;
  pointer pcVar38;
  ulong uVar39;
  pointer ppVar40;
  pointer ppVar41;
  pointer ppVar42;
  ulong uVar43;
  _Alloc_hider _Var44;
  long lVar45;
  long lVar46;
  pointer ppVar47;
  uint uVar48;
  uint uVar49;
  size_type sVar50;
  uint uVar51;
  key_type *pkVar52;
  long lVar53;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar54;
  pointer ppVar55;
  byte bVar56;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableCache_*>_>,_std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableCache_*>_>_>
  pVar57;
  string __str_4;
  value_type top;
  stat st;
  string __str_6;
  string nextDir;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  compactionFiles;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  dirFiles;
  SSTableDic t;
  string dir;
  SSTableDic mergedDic;
  vector<unsigned_long,_std::allocator<unsigned_long>_> indices;
  vector<std::vector<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  dics;
  undefined1 in_stack_fffffffffffffc98 [11];
  undefined1 in_stack_fffffffffffffca3;
  __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableHeader>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableHeader>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableHeader>_>_>_>
  in_stack_fffffffffffffca8;
  __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableHeader>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableHeader>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableHeader>_>_>_>
  _Var58;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableHeader>
  *ppVar59;
  pointer in_stack_fffffffffffffcb0;
  undefined1 local_348 [40];
  undefined1 local_320 [64];
  key_type *local_2e0;
  undefined1 local_2d8 [16];
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableHeader>
  local_2c8 [2];
  pointer *local_248;
  long local_240;
  pointer local_238 [2];
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableHeader>
  local_228;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1c8;
  size_type local_1b0;
  SSTableDic local_1a8;
  _WordT *local_190;
  long local_188;
  _WordT local_180;
  undefined8 uStack_178;
  key_type *local_170;
  vector<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_168;
  _WordT *local_148;
  undefined8 local_140;
  _WordT local_138;
  undefined8 uStack_130;
  string local_128;
  value_type *local_108;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_100;
  vector<std::vector<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  local_e8;
  string local_d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_b0 [2];
  undefined1 local_a0 [16];
  pointer local_90;
  undefined1 local_80 [16];
  pointer local_70;
  undefined1 local_60 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  _WordT local_40 [2];
  stat *__buf;
  
  pcVar33 = (this->storagePath)._M_dataplus._M_p;
  local_348._16_8_ = this;
  local_2d8._0_8_ = local_2c8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_2d8,pcVar33,pcVar33 + (this->storagePath)._M_string_length);
  std::__cxx11::string::append((char *)local_2d8);
  uVar29 = -level;
  if (0 < level) {
    uVar29 = level;
  }
  uVar48 = 1;
  if (9 < uVar29) {
    uVar26 = (ulong)uVar29;
    uVar51 = 4;
    do {
      uVar48 = uVar51;
      uVar49 = (uint)uVar26;
      if (uVar49 < 100) {
        uVar48 = uVar48 - 2;
        goto LAB_00104976;
      }
      if (uVar49 < 1000) {
        uVar48 = uVar48 - 1;
        goto LAB_00104976;
      }
      if (uVar49 < 10000) goto LAB_00104976;
      uVar26 = uVar26 / 10000;
      uVar51 = uVar48 + 4;
    } while (99999 < uVar49);
    uVar48 = uVar48 + 1;
  }
LAB_00104976:
  local_228.first._M_dataplus._M_p = (pointer)&local_228.first.field_2;
  local_348._32_8_ =
       (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,SSTableCache*>,std::_Select1st<std::pair<std::__cxx11::string_const,SSTableCache*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,SSTableCache*>>>
        *)(ulong)(uint)level;
  std::__cxx11::string::_M_construct((ulong)&local_228,(char)uVar48 - (char)(level >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_228.first._M_dataplus._M_p + ((uint)level >> 0x1f),uVar48,uVar29);
  pcVar33 = (pointer)((long)&(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_2d8._8_8_)->_M_dataplus)._M_p + local_228.first._M_string_length
                     );
  _Var44._M_p = (pointer)0xf;
  if ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableHeader>
       *)local_2d8._0_8_ != local_2c8) {
    _Var44._M_p = local_2c8[0].first._M_dataplus._M_p;
  }
  paVar54 = &local_228.first.field_2;
  ppVar42 = (pointer)local_2d8._8_8_;
  if (_Var44._M_p < pcVar33) {
    uVar36 = (pointer)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228.first._M_dataplus._M_p != paVar54) {
      uVar36 = local_228.first.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar36 < pcVar33) goto LAB_00104a10;
    puVar19 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_228,0,(char *)0x0,local_2d8._0_8_);
  }
  else {
LAB_00104a10:
    puVar19 = (undefined8 *)
              std::__cxx11::string::_M_append(local_2d8,(ulong)local_228.first._M_dataplus._M_p);
  }
  local_190 = &local_180;
  p_Var1 = puVar19 + 2;
  if ((_WordT *)*puVar19 == p_Var1) {
    local_180 = *p_Var1;
    uStack_178 = puVar19[3];
  }
  else {
    local_180 = *p_Var1;
    local_190 = (_WordT *)*puVar19;
  }
  local_188 = puVar19[1];
  *puVar19 = p_Var1;
  puVar19[1] = 0;
  *(undefined1 *)p_Var1 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228.first._M_dataplus._M_p != paVar54) {
    operator_delete(local_228.first._M_dataplus._M_p,
                    (ulong)(local_228.first.field_2._M_allocated_capacity + 1));
  }
  if ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableHeader>
       *)local_2d8._0_8_ != local_2c8) {
    operator_delete((void *)local_2d8._0_8_,(ulong)(local_2c8[0].first._M_dataplus._M_p + 1));
  }
  local_50._M_allocated_capacity = (size_type)local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_60 + 0x10),local_190,(undefined1 *)(local_188 + (long)local_190));
  iVar16 = stat((char *)local_50._M_allocated_capacity,(stat *)local_2d8);
  uVar29 = (uint)(undefined4)local_2c8[0].first._M_string_length >> 0xe;
  if ((_WordT *)local_50._M_allocated_capacity != local_40) {
    operator_delete((void *)local_50._M_allocated_capacity,local_40[0] + 1);
  }
  if (((byte)uVar29 & 1 & iVar16 == 0) == 0) goto LAB_001061f0;
  local_1c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (key_type *)0x0;
  local_1c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (key_type *)0x0;
  local_1c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar48 = (int)local_348._32_8_ + 1;
  iVar16 = 1;
  uVar29 = uVar48;
  if (-1 < (int)local_348._32_8_) {
    do {
      iVar16 = iVar16 * 2;
      uVar29 = uVar29 - 1;
    } while (uVar29 != 0);
  }
  local_90 = (pointer)local_80;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,local_190,(undefined1 *)(local_188 + (long)local_190));
  path._M_string_length._3_1_ = in_stack_fffffffffffffca3;
  path._0_11_ = in_stack_fffffffffffffc98;
  path._M_string_length._4_4_ = uVar48;
  path.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffffca8._M_current;
  path.field_2._8_8_ = in_stack_fffffffffffffcb0;
  iVar17 = utils::scanDir(path,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)local_90);
  local_2e0 = (key_type *)CONCAT44(local_2e0._4_4_,iVar17);
  if (local_90 != (pointer)local_80) {
    operator_delete(local_90,(ulong)((long)&((_Alloc_hider *)local_80._0_8_)->_M_p + 1));
  }
  pbVar31 = local_1c8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (iVar16 < (int)local_2e0) {
    if (local_1c8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_1c8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pbVar30 = local_1c8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        local_2d8._0_8_ = local_2c8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_2d8,local_190,(undefined1 *)(local_188 + (long)local_190));
        std::__cxx11::string::_M_replace_aux((ulong)local_2d8,local_2d8._8_8_,0,'\x01');
        ppVar42 = (pointer)local_2d8._8_8_;
        std::__cxx11::string::replace((ulong)pbVar30,0,(char *)0x0,local_2d8._0_8_);
        if ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableHeader>
             *)local_2d8._0_8_ != local_2c8) {
          operator_delete((void *)local_2d8._0_8_,(ulong)(local_2c8[0].first._M_dataplus._M_p + 1));
        }
        pbVar30 = pbVar30 + 1;
      } while (pbVar30 != pbVar31);
    }
    local_1e8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (key_type *)0x0;
    local_1e8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (key_type *)0x0;
    local_1e8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (local_348._32_4_ == 0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(&local_1e8,&local_1c8);
    }
    else {
      in_stack_fffffffffffffca8._M_current =
           (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableHeader>
            *)0x0;
      in_stack_fffffffffffffcb0 = (pointer)0x0;
      local_348._0_8_ = (pointer)0x0;
      local_2d8._0_8_ =
           (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableHeader>
            *)0x0;
      local_2d8._8_8_ = (pointer)0x0;
      local_2c8[0].first._M_dataplus._M_p = (pointer)0x0;
      std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableHeader>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableHeader>_>_>
      ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableHeader>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableHeader>_>_>
                 *)local_2d8);
      pbVar31 = local_1c8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (local_1c8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_1c8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        local_348._24_8_ = local_348._16_8_ + 0x2760;
        pbVar30 = local_1c8.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        do {
          ppSVar20 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableCache_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableCache_*>_>_>
                     ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableCache_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableCache_*>_>_>
                           *)local_348._24_8_,pbVar30);
          SSTableCache::getHeader(*ppSVar20);
          std::
          vector<std::pair<std::__cxx11::string,SSTableHeader>,std::allocator<std::pair<std::__cxx11::string,SSTableHeader>>>
          ::emplace_back<std::__cxx11::string_const&,SSTableHeader>
                    ((vector<std::pair<std::__cxx11::string,SSTableHeader>,std::allocator<std::pair<std::__cxx11::string,SSTableHeader>>>
                      *)&stack0xfffffffffffffca8,pbVar30,(SSTableHeader *)local_320);
          _Var58._M_current = in_stack_fffffffffffffca8._M_current;
          ppVar40 = in_stack_fffffffffffffcb0;
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableHeader>
          ::pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableHeader>
                  *)local_2d8,in_stack_fffffffffffffcb0 + -1);
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableHeader>
          ::pair(&local_228,
                 (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableHeader>
                  *)local_2d8);
          std::
          __push_heap<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string,SSTableHeader>*,std::vector<std::pair<std::__cxx11::string,SSTableHeader>,std::allocator<std::pair<std::__cxx11::string,SSTableHeader>>>>,long,std::pair<std::__cxx11::string,SSTableHeader>,__gnu_cxx::__ops::_Iter_comp_val<KVStore::compaction(int)::__0>>
                    (in_stack_fffffffffffffca8,
                     ((long)in_stack_fffffffffffffcb0 - (long)in_stack_fffffffffffffca8._M_current
                     >> 6) + -1,0,&local_228,
                     (_Iter_comp_val<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_markcty[P]LSM_KV_kvstore_cpp:130:16)>
                      *)ppVar42);
          in_stack_fffffffffffffca8._M_current = _Var58._M_current;
          in_stack_fffffffffffffcb0 = ppVar40;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_228.first._M_dataplus._M_p != &local_228.first.field_2) {
            operator_delete(local_228.first._M_dataplus._M_p,
                            (ulong)(local_228.first.field_2._M_allocated_capacity + 1));
            in_stack_fffffffffffffca8._M_current = _Var58._M_current;
            in_stack_fffffffffffffcb0 = ppVar40;
          }
          if ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableHeader>
               *)local_2d8._0_8_ != local_2c8) {
            operator_delete((void *)local_2d8._0_8_,(ulong)(local_2c8[0].first._M_dataplus._M_p + 1)
                           );
          }
          pbVar30 = pbVar30 + 1;
        } while (pbVar30 != pbVar31);
      }
      iVar16 = iVar16 - (int)local_2e0;
      if (iVar16 != 0) {
        do {
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableHeader>
          ::pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableHeader>
                  *)local_320,in_stack_fffffffffffffca8._M_current);
          if (0x40 < (long)in_stack_fffffffffffffcb0 - (long)in_stack_fffffffffffffca8._M_current) {
            ppVar25 = in_stack_fffffffffffffcb0 + -1;
            ppVar59 = in_stack_fffffffffffffca8._M_current;
            ppVar42 = in_stack_fffffffffffffcb0;
            std::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableHeader>
            ::pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableHeader>
                    *)local_2d8,ppVar25);
            std::__cxx11::string::operator=
                      ((string *)ppVar25,(string *)in_stack_fffffffffffffca8._M_current);
            uVar9 = ((in_stack_fffffffffffffca8._M_current)->second).length;
            uVar10 = ((in_stack_fffffffffffffca8._M_current)->second).minKey;
            uVar11 = ((in_stack_fffffffffffffca8._M_current)->second).maxKey;
            in_stack_fffffffffffffcb0[-1].second.timeStamp =
                 ((in_stack_fffffffffffffca8._M_current)->second).timeStamp;
            in_stack_fffffffffffffcb0[-1].second.length = uVar9;
            in_stack_fffffffffffffcb0[-1].second.minKey = uVar10;
            in_stack_fffffffffffffcb0[-1].second.maxKey = uVar11;
            std::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableHeader>
            ::pair(&local_228,
                   (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableHeader>
                    *)local_2d8);
            std::
            __adjust_heap<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string,SSTableHeader>*,std::vector<std::pair<std::__cxx11::string,SSTableHeader>,std::allocator<std::pair<std::__cxx11::string,SSTableHeader>>>>,long,std::pair<std::__cxx11::string,SSTableHeader>,__gnu_cxx::__ops::_Iter_comp_iter<KVStore::compaction(int)::__0>>
                      (in_stack_fffffffffffffca8._M_current,0,
                       (long)ppVar25 - (long)in_stack_fffffffffffffca8._M_current >> 6,&local_228);
            in_stack_fffffffffffffca8._M_current = ppVar59;
            in_stack_fffffffffffffcb0 = ppVar42;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_228.first._M_dataplus._M_p != &local_228.first.field_2) {
              operator_delete(local_228.first._M_dataplus._M_p,
                              (ulong)(local_228.first.field_2._M_allocated_capacity + 1));
              in_stack_fffffffffffffca8._M_current = ppVar59;
              in_stack_fffffffffffffcb0 = ppVar42;
            }
            if ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableHeader>
                 *)local_2d8._0_8_ != local_2c8) {
              operator_delete((void *)local_2d8._0_8_,
                              (ulong)(local_2c8[0].first._M_dataplus._M_p + 1));
            }
          }
          ppVar42 = in_stack_fffffffffffffcb0 + -1;
          pcVar33 = in_stack_fffffffffffffcb0[-1].first._M_dataplus._M_p;
          paVar54 = &in_stack_fffffffffffffcb0[-1].first.field_2;
          in_stack_fffffffffffffcb0 = ppVar42;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar33 != paVar54) {
            operator_delete(pcVar33,paVar54->_M_allocated_capacity + 1);
            in_stack_fffffffffffffcb0 = ppVar42;
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&local_1e8,(value_type *)local_320);
          if ((SSTableCache *)local_320._0_8_ != (SSTableCache *)(local_320 + 0x10)) {
            operator_delete((void *)local_320._0_8_,(ulong)(local_320._16_8_ + 1));
          }
          iVar16 = iVar16 + 1;
        } while (iVar16 != 0);
      }
      std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableHeader>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableHeader>_>_>
      ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableHeader>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableHeader>_>_>
                 *)&stack0xfffffffffffffca8);
    }
    pbVar31 = local_1e8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (local_1e8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        local_1e8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      _Var44._M_p = (pointer)0xffffffffffffffff;
      local_348._24_8_ =
           (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableHeader>
            *)0x0;
      pcVar33 = (pointer)0x0;
    }
    else {
      pmVar4 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableCache_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableCache_*>_>_>
                *)(local_348._16_8_ + 0x2760);
      pcVar33 = (pointer)0x0;
      local_348._24_8_ =
           (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableHeader>
            *)0x0;
      pbVar30 = local_1e8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pcVar35 = (pointer)0xffffffffffffffff;
      do {
        ppSVar20 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableCache_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableCache_*>_>_>
                   ::at(pmVar4,pbVar30);
        SSTableCache::getHeader(*ppSVar20);
        if (pcVar33 < local_2c8[0].first._M_string_length) {
          pcVar33 = (pointer)local_2c8[0].first._M_string_length;
        }
        _Var44._M_p = local_2c8[0].first._M_dataplus._M_p;
        if (pcVar35 < local_2c8[0].first._M_dataplus._M_p) {
          _Var44._M_p = pcVar35;
        }
        if ((ulong)local_348._24_8_ < (ulong)local_2d8._0_8_) {
          local_348._24_8_ = local_2d8._0_8_;
        }
        pbVar30 = pbVar30 + 1;
        pcVar35 = _Var44._M_p;
      } while (pbVar30 != pbVar31);
    }
    local_2d8._0_8_ = local_2c8;
    pcVar35 = (((string *)(local_348._16_8_ + 8))->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_2d8,pcVar35,pcVar35 + *(size_type *)(local_348._16_8_ + 0x10));
    std::__cxx11::string::append(local_2d8);
    uVar29 = -uVar48;
    if (0 < (int)uVar48) {
      uVar29 = uVar48;
    }
    uVar51 = 1;
    if (9 < uVar29) {
      uVar26 = (ulong)uVar29;
      uVar49 = 4;
      do {
        uVar51 = uVar49;
        uVar24 = (uint)uVar26;
        if (uVar24 < 100) {
          uVar51 = uVar51 - 2;
          goto LAB_00105074;
        }
        if (uVar24 < 1000) {
          uVar51 = uVar51 - 1;
          goto LAB_00105074;
        }
        if (uVar24 < 10000) goto LAB_00105074;
        uVar26 = uVar26 / 10000;
        uVar49 = uVar51 + 4;
      } while (99999 < uVar24);
      uVar51 = uVar51 + 1;
    }
LAB_00105074:
    uVar49 = uVar48 >> 0x1f;
    local_320._0_8_ = local_320 + 0x10;
    std::__cxx11::string::_M_construct((ulong)local_320,(char)uVar51 - (char)((int)uVar48 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)(local_320._0_8_ + (ulong)uVar49),uVar51,uVar29);
    pcVar35 = (pointer)((long)&(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_2d8._8_8_)->_M_dataplus)._M_p + local_320._8_8_);
    _Var37._M_p = (pointer)0xf;
    if ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableHeader>
         *)local_2d8._0_8_ != local_2c8) {
      _Var37._M_p = local_2c8[0].first._M_dataplus._M_p;
    }
    if (_Var37._M_p < pcVar35) {
      pcVar38 = (pointer)0xf;
      if ((undefined1 *)local_320._0_8_ != local_320 + 0x10) {
        pcVar38 = (pointer)local_320._16_8_;
      }
      if (pcVar38 < pcVar35) goto LAB_0010510b;
      puVar19 = (undefined8 *)
                std::__cxx11::string::replace((ulong)local_320,0,(char *)0x0,local_2d8._0_8_);
    }
    else {
LAB_0010510b:
      puVar19 = (undefined8 *)std::__cxx11::string::_M_append(local_2d8,local_320._0_8_);
    }
    puVar2 = puVar19 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar19 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar2) {
      local_228.first.field_2._M_allocated_capacity = *puVar2;
      local_228.first.field_2._8_8_ = puVar19[3];
      local_228.first._M_dataplus._M_p = (pointer)&local_228.first.field_2;
    }
    else {
      local_228.first.field_2._M_allocated_capacity = *puVar2;
      local_228.first._M_dataplus._M_p = (pointer)*puVar19;
    }
    local_228.first._M_string_length = puVar19[1];
    *puVar19 = puVar2;
    puVar19[1] = 0;
    *(undefined1 *)puVar2 = 0;
    if ((undefined1 *)local_320._0_8_ != local_320 + 0x10) {
      operator_delete((void *)local_320._0_8_,(ulong)(local_320._16_8_ + 1));
    }
    if ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableHeader>
         *)local_2d8._0_8_ != local_2c8) {
      operator_delete((void *)local_2d8._0_8_,(ulong)(local_2c8[0].first._M_dataplus._M_p + 1));
    }
    local_70 = (pointer)local_60;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,local_228.first._M_dataplus._M_p,
               local_228.first._M_dataplus._M_p + local_228.first._M_string_length);
    __buf = (stat *)local_2d8;
    iVar16 = stat((char *)local_70,__buf);
    __mode = (__mode_t)__buf;
    uVar29 = (uint)(undefined4)local_2c8[0].first._M_string_length >> 0xe;
    if (local_70 != (pointer)local_60) {
      pcVar35 = (pointer)(local_60._0_8_ + 1);
      operator_delete(local_70,(ulong)pcVar35);
      __mode = (__mode_t)pcVar35;
    }
    if (((byte)uVar29 & 1 & iVar16 == 0) == 0) {
      utils::mkdir(local_228.first._M_dataplus._M_p,__mode);
    }
    pbVar30 = local_1c8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    pbVar31 = local_1c8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (local_1c8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_1c8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      paVar54 = &(local_1c8.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->field_2;
      do {
        plVar21 = (long *)(((key_type *)(paVar54 + -1))->_M_dataplus)._M_p;
        if (paVar54 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)plVar21) {
          operator_delete(plVar21,paVar54->_M_allocated_capacity + 1);
        }
        pkVar52 = (key_type *)(paVar54 + 1);
        paVar54 = paVar54 + 2;
      } while (pkVar52 != pbVar30);
      local_1c8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pbVar31;
    }
    local_b0[0] = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_a0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_b0,local_228.first._M_dataplus._M_p,
               local_228.first._M_dataplus._M_p + local_228.first._M_string_length);
    path_00._M_string_length._3_1_ = in_stack_fffffffffffffca3;
    path_00._0_11_ = in_stack_fffffffffffffc98;
    path_00._M_string_length._4_4_ = uVar48;
    path_00.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffffca8._M_current;
    path_00.field_2._8_8_ = in_stack_fffffffffffffcb0;
    utils::scanDir(path_00,local_b0[0]);
    if (local_b0[0] !=
        (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)local_a0) {
      operator_delete(local_b0[0],(ulong)((long)&((_Alloc_hider *)local_a0._0_8_)->_M_p + 1));
    }
    pbVar31 = local_1c8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (local_1c8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_1c8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pbVar30 = local_1c8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        local_2d8._0_8_ = local_2c8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_2d8,local_228.first._M_dataplus._M_p,
                   local_228.first._M_dataplus._M_p + local_228.first._M_string_length);
        std::__cxx11::string::_M_replace_aux((ulong)local_2d8,local_2d8._8_8_,0,'\x01');
        std::__cxx11::string::replace((ulong)pbVar30,0,(char *)0x0,local_2d8._0_8_);
        if ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableHeader>
             *)local_2d8._0_8_ != local_2c8) {
          operator_delete((void *)local_2d8._0_8_,(ulong)(local_2c8[0].first._M_dataplus._M_p + 1));
        }
        pbVar13 = local_1c8.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        pbVar30 = pbVar30 + 1;
      } while (pbVar30 != pbVar31);
      if (local_1c8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_1c8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        pmVar4 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableCache_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableCache_*>_>_>
                  *)(local_348._16_8_ + 0x2760);
        pbVar31 = local_1c8.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        do {
          ppSVar20 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableCache_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableCache_*>_>_>
                     ::at(pmVar4,pbVar31);
          SSTableCache::getHeader(*ppSVar20);
          if (((local_2c8[0].first._M_dataplus._M_p <= pcVar33 &&
                _Var44._M_p <= local_2c8[0].first._M_dataplus._M_p) ||
              (local_2c8[0].first._M_string_length <= pcVar33 &&
               _Var44._M_p <= local_2c8[0].first._M_string_length)) &&
             (std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back(&local_1e8,pbVar31), (ulong)local_348._24_8_ <= (ulong)local_2d8._0_8_)) {
            local_348._24_8_ = local_2d8._0_8_;
          }
          pbVar31 = pbVar31 + 1;
        } while (pbVar31 != pbVar13);
      }
    }
    local_2e0 = local_1e8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    local_170 = local_1e8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    local_320._0_8_ = local_320 + 0x10;
    pcVar33 = (((string *)(local_348._16_8_ + 8))->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_320,pcVar33,pcVar33 + *(size_type *)(local_348._16_8_ + 0x10));
    std::__cxx11::string::append(local_320);
    uVar51 = (int)local_348._32_8_ + 2;
    uVar29 = -uVar51;
    if (0 < (int)uVar51) {
      uVar29 = uVar51;
    }
    uVar49 = 1;
    if (9 < uVar29) {
      uVar26 = (ulong)uVar29;
      uVar24 = 4;
      do {
        uVar49 = uVar24;
        uVar18 = (uint)uVar26;
        if (uVar18 < 100) {
          uVar49 = uVar49 - 2;
          goto LAB_001054f4;
        }
        if (uVar18 < 1000) {
          uVar49 = uVar49 - 1;
          goto LAB_001054f4;
        }
        if (uVar18 < 10000) goto LAB_001054f4;
        uVar26 = uVar26 / 10000;
        uVar24 = uVar49 + 4;
      } while (99999 < uVar18);
      uVar49 = uVar49 + 1;
    }
LAB_001054f4:
    ppVar40 = (pointer)local_348;
    std::__cxx11::string::_M_construct
              ((ulong)&stack0xfffffffffffffca8,(char)uVar49 - (char)((int)uVar51 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)((long)&(ppVar40->first)._M_dataplus._M_p + (ulong)(uVar51 >> 0x1f)),uVar49,
               uVar29);
    ppVar42 = (pointer)((long)&(in_stack_fffffffffffffcb0->first)._M_dataplus._M_p + local_320._8_8_
                       );
    ppVar41 = (pointer)0xf;
    if ((SSTableCache *)local_320._0_8_ != (SSTableCache *)(local_320 + 0x10)) {
      ppVar41 = (pointer)local_320._16_8_;
    }
    if (ppVar41 < ppVar42) {
      ppVar41 = (pointer)0xf;
      if (ppVar40 != (pointer)local_348) {
        ppVar41 = (pointer)local_348._0_8_;
      }
      if (ppVar41 < ppVar42) goto LAB_00105573;
      puVar19 = (undefined8 *)
                std::__cxx11::string::replace
                          ((ulong)&stack0xfffffffffffffca8,0,(char *)0x0,local_320._0_8_);
    }
    else {
LAB_00105573:
      puVar19 = (undefined8 *)std::__cxx11::string::_M_append(local_320,(ulong)ppVar40);
    }
    local_148 = &local_138;
    p_Var1 = puVar19 + 2;
    if ((_WordT *)*puVar19 == p_Var1) {
      local_138 = *p_Var1;
      uStack_130 = puVar19[3];
    }
    else {
      local_138 = *p_Var1;
      local_148 = (_WordT *)*puVar19;
    }
    local_140 = puVar19[1];
    *puVar19 = p_Var1;
    puVar19[1] = 0;
    *(undefined1 *)p_Var1 = 0;
    iVar16 = stat((char *)local_148,(stat *)local_2d8);
    bVar56 = iVar16 == 0;
    uVar12 = (undefined4)local_2c8[0].first._M_string_length;
    if (local_148 != &local_138) {
      operator_delete(local_148,local_138 + 1);
    }
    if (ppVar40 != (pointer)local_348) {
      operator_delete(ppVar40,(ulong)(local_348._0_8_ + 1));
    }
    if ((SSTableCache *)local_320._0_8_ != (SSTableCache *)(local_320 + 0x10)) {
      operator_delete((void *)local_320._0_8_,(ulong)(local_320._16_8_ + 1));
    }
    std::
    vector<std::vector<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
    ::vector(&local_e8,
             (long)local_1e8.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_1e8.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5,(allocator_type *)local_2d8);
    local_348._32_4_ = uVar12;
    local_1b0 = (long)local_170 - (long)local_2e0 >> 5;
    if (local_170 == local_2e0) {
      lVar46 = 0;
    }
    else {
      lVar53 = local_1b0 + (local_1b0 == 0);
      lVar45 = 0;
      lVar32 = 0;
      lVar46 = 0;
      do {
        SSTable::readDic((string *)
                         ((long)&((local_1e8.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                         lVar32),(SSTableDic *)
                                 ((long)&((local_e8.
                                           super__Vector_base<std::vector<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->
                                         super__Vector_base<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         )._M_impl.super__Vector_impl_data._M_start + lVar45));
        unlink(*(char **)((long)&((local_1e8.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                         lVar32));
        lVar46 = lVar46 + (*(long *)((long)&((local_e8.
                                              super__Vector_base<std::vector<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->
                                            super__Vector_base<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                            )._M_impl.super__Vector_impl_data._M_finish + lVar45) -
                           *(long *)((long)&((local_e8.
                                              super__Vector_base<std::vector<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->
                                            super__Vector_base<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                            )._M_impl.super__Vector_impl_data._M_start + lVar45) >>
                          3) * -0x3333333333333333;
        lVar32 = lVar32 + 0x20;
        lVar45 = lVar45 + 0x18;
        lVar53 = lVar53 + -1;
      } while (lVar53 != 0);
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (&local_100,local_1b0,(allocator_type *)local_2d8);
    local_168.
    super__Vector_base<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (value_type *)0x0;
    local_168.
    super__Vector_base<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (value_type *)0x0;
    local_168.
    super__Vector_base<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (lVar46 == 0) {
      local_1a8.
      super__Vector_base<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_1a8.
      super__Vector_base<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_1a8.
      super__Vector_base<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      sVar34 = local_1b0;
      uVar29 = uVar48;
    }
    else {
      bVar56 = bVar56 & (byte)((uint)local_348._32_4_ >> 0xe) & 1;
      uVar26 = local_1b0 + (local_1b0 == 0);
      local_348._32_8_ = local_348._16_8_ + 0x2760;
      ppVar25 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableHeader>
                 *)0x0;
      do {
        if (local_170 == local_2e0) {
          lVar32 = 0;
        }
        else {
          pppVar27 = &((local_e8.
                        super__Vector_base<std::vector<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->
                      super__Vector_base<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish;
          uVar39 = 0xffffffffffffffff;
          uVar28 = 0;
          uVar43 = 0;
          do {
            if ((local_100.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                 .super__Vector_impl_data._M_start[uVar43] <
                 (ulong)(((long)*pppVar27 - (long)((_Vector_impl_data *)(pppVar27 + -1))->_M_start
                         >> 3) * -0x3333333333333333)) &&
               (uVar6 = ((_Vector_impl_data *)(pppVar27 + -1))->_M_start
                        [local_100.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar43]].first, uVar6 < uVar39))
            {
              uVar28 = uVar43 & 0xffffffff;
              uVar39 = uVar6;
            }
            uVar43 = uVar43 + 1;
            pppVar27 = pppVar27 + 3;
          } while (uVar26 != uVar43);
          lVar32 = (long)(int)uVar28;
        }
        uVar39 = local_100.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                 .super__Vector_impl_data._M_start[lVar32];
        local_100.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[lVar32] = uVar39 + 1;
        ppVar47 = local_e8.
                  super__Vector_base<std::vector<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[lVar32].
                  super__Vector_base<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        uVar28 = ((long)local_e8.
                        super__Vector_base<std::vector<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[lVar32].
                        super__Vector_base<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar47 >> 3) *
                 -0x3333333333333333;
        if (uVar28 < uVar39 || uVar28 - uVar39 == 0) {
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     uVar39);
          goto LAB_00106234;
        }
        ppSVar20 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableCache_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableCache_*>_>_>
                   ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableCache_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableCache_*>_>_>
                         *)local_348._32_8_,
                        local_1e8.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + lVar32);
        SSTableCache::getHeader(*ppSVar20);
        ppVar47 = ppVar47 + uVar39;
        if ((local_168.
             super__Vector_base<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start ==
             local_168.
             super__Vector_base<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish) ||
           (ppVar47->first !=
            local_168.
            super__Vector_base<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish[-1].first)) {
LAB_001058ba:
          std::
          vector<std::pair<unsigned_long,std::__cxx11::string>,std::allocator<std::pair<unsigned_long,std::__cxx11::string>>>
          ::emplace_back<unsigned_long_const&,std::__cxx11::string_const&>
                    ((vector<std::pair<unsigned_long,std::__cxx11::string>,std::allocator<std::pair<unsigned_long,std::__cxx11::string>>>
                      *)&local_168,&ppVar47->first,&ppVar47->second);
          ppVar25 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableHeader>
                     *)local_2d8._0_8_;
        }
        else if (ppVar25 <= (ulong)local_2d8._0_8_) {
          pvVar3 = local_168.
                   super__Vector_base<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish + -1;
          pcVar33 = local_168.
                    super__Vector_base<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish[-1].second._M_dataplus._M_p;
          paVar54 = &local_168.
                     super__Vector_base<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish[-1].second.field_2;
          local_168.
          super__Vector_base<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = pvVar3;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar33 != paVar54) {
            operator_delete(pcVar33,paVar54->_M_allocated_capacity + 1);
          }
          goto LAB_001058ba;
        }
        lVar46 = lVar46 + -1;
      } while (lVar46 != 0);
      local_1a8.
      super__Vector_base<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_1a8.
      super__Vector_base<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_1a8.
      super__Vector_base<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_108 = local_168.
                  super__Vector_base<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      sVar34 = local_1b0;
      uVar29 = uVar48;
      if (local_168.
          super__Vector_base<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_168.
          super__Vector_base<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        lVar46 = 0;
        lVar32 = 0;
        ppVar47 = local_168.
                  super__Vector_base<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        do {
          if ((bVar56 != 0) ||
             (iVar16 = std::__cxx11::string::compare((char *)&ppVar47->second), iVar16 != 0)) {
            sVar50 = (ppVar47->second)._M_string_length;
            if (0x1fffff < lVar32 + lVar46 * 0xc + sVar50 + 0x2838) {
              ppVar42 = (pointer)local_348;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&stack0xfffffffffffffca8,local_228.first._M_dataplus._M_p,
                         local_228.first._M_dataplus._M_p + local_228.first._M_string_length);
              std::__cxx11::string::append((char *)&stack0xfffffffffffffca8);
              uVar48 = *(int *)(local_348._16_8_ + 0x30);
              *(uint *)(local_348._16_8_ + 0x30) = uVar48 + 1;
              uVar51 = -uVar48;
              if (0 < (int)uVar48) {
                uVar51 = uVar48;
              }
              uVar49 = 1;
              if (9 < uVar51) {
                uVar26 = (ulong)uVar51;
                uVar24 = 4;
                do {
                  uVar49 = uVar24;
                  uVar18 = (uint)uVar26;
                  if (uVar18 < 100) {
                    uVar49 = uVar49 - 2;
                    goto LAB_00105a09;
                  }
                  if (uVar18 < 1000) {
                    uVar49 = uVar49 - 1;
                    goto LAB_00105a09;
                  }
                  if (uVar18 < 10000) goto LAB_00105a09;
                  uVar26 = uVar26 / 10000;
                  uVar24 = uVar49 + 4;
                } while (99999 < uVar18);
                uVar49 = uVar49 + 1;
              }
LAB_00105a09:
              local_248 = local_238;
              std::__cxx11::string::_M_construct
                        ((ulong)&local_248,(char)uVar49 - (char)((int)uVar48 >> 0x1f));
              std::__detail::__to_chars_10_impl<unsigned_int>
                        ((char *)((ulong)(uVar48 >> 0x1f) + (long)local_248),uVar49,uVar51);
              ppVar40 = (pointer)0xf;
              if (ppVar42 != (pointer)local_348) {
                ppVar40 = (pointer)local_348._0_8_;
              }
              ppVar41 = (pointer)((long)&(in_stack_fffffffffffffcb0->first)._M_dataplus._M_p +
                                 local_240);
              if (ppVar40 < ppVar41) {
                ppVar40 = (pointer)0xf;
                if (local_248 != local_238) {
                  ppVar40 = local_238[0];
                }
                if (ppVar40 < ppVar41) goto LAB_00105aad;
                puVar19 = (undefined8 *)
                          std::__cxx11::string::replace
                                    ((ulong)&local_248,0,(char *)0x0,(ulong)ppVar42);
                uVar48 = uVar29;
              }
              else {
LAB_00105aad:
                puVar19 = (undefined8 *)
                          std::__cxx11::string::_M_append(&stack0xfffffffffffffca8,(ulong)local_248)
                ;
                uVar48 = uVar29;
              }
              local_320._0_8_ = local_320 + 0x10;
              pcVar33 = (pointer)(puVar19 + 2);
              if ((pointer)*puVar19 == pcVar33) {
                local_320._16_8_ = *(undefined8 *)pcVar33;
                local_320._24_8_ = puVar19[3];
              }
              else {
                local_320._16_8_ = *(undefined8 *)pcVar33;
                local_320._0_8_ = (pointer)*puVar19;
              }
              local_320._8_8_ = puVar19[1];
              *puVar19 = pcVar33;
              puVar19[1] = 0;
              *pcVar33 = '\0';
              plVar21 = (long *)std::__cxx11::string::append(local_320);
              ppVar25 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableHeader>
                         *)(plVar21 + 2);
              if ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableHeader>
                   *)*plVar21 == ppVar25) {
                local_2c8[0].first._M_dataplus._M_p = (ppVar25->first)._M_dataplus._M_p;
                local_2c8[0].first._M_string_length = plVar21[3];
                local_2d8._0_8_ = local_2c8;
              }
              else {
                local_2c8[0].first._M_dataplus._M_p = (ppVar25->first)._M_dataplus._M_p;
                local_2d8._0_8_ =
                     (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableHeader>
                      *)*plVar21;
              }
              local_2d8._8_8_ = plVar21[1];
              *plVar21 = (long)ppVar25;
              plVar21[1] = 0;
              *(undefined1 *)(plVar21 + 2) = 0;
              if ((undefined1 *)local_320._0_8_ != local_320 + 0x10) {
                operator_delete((void *)local_320._0_8_,(ulong)(local_320._16_8_ + 1));
              }
              if (local_248 != local_238) {
                operator_delete(local_248,(ulong)((long)&(local_238[0]->first)._M_dataplus._M_p + 1)
                               );
              }
              if (ppVar42 != (pointer)local_348) {
                operator_delete(ppVar42,(ulong)(local_348._0_8_ + 1));
              }
              SSTable::toSSTable((SSTable *)&local_1a8,(SSTableDic *)local_2d8,
                                 (string *)local_348._24_8_,(uint64_t)ppVar25);
              pSVar22 = (SSTableCache *)operator_new(0x2858);
              local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_128,local_2d8._0_8_,
                         (pointer)(local_2d8._0_8_ +
                                  (long)(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_2d8._8_8_));
              SSTableCache::SSTableCache(pSVar22,&local_1a8,local_348._24_8_,&local_128);
              local_320._0_8_ = pSVar22;
              std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,SSTableCache*>,std::_Select1st<std::pair<std::__cxx11::string_const,SSTableCache*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,SSTableCache*>>>
              ::_M_emplace_unique<std::__cxx11::string&,SSTableCache*>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,SSTableCache*>,std::_Select1st<std::pair<std::__cxx11::string_const,SSTableCache*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,SSTableCache*>>>
                          *)local_348._32_8_,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_2d8,(SSTableCache **)local_320);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_128._M_dataplus._M_p != &local_128.field_2) {
                operator_delete(local_128._M_dataplus._M_p,
                                local_128.field_2._M_allocated_capacity + 1);
              }
              ppVar15 = local_1a8.
                        super__Vector_base<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              ppVar14 = local_1a8.
                        super__Vector_base<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              sVar34 = local_1b0;
              if (local_1a8.
                  super__Vector_base<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish !=
                  local_1a8.
                  super__Vector_base<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start) {
                paVar54 = &((local_1a8.
                             super__Vector_base<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->second).field_2;
                do {
                  plVar21 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)(paVar54 + -1))->_M_dataplus)._M_p;
                  if (paVar54 !=
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)plVar21) {
                    operator_delete(plVar21,paVar54->_M_allocated_capacity + 1);
                  }
                  ppVar55 = (pointer)(paVar54 + 1);
                  paVar54 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)((long)paVar54 + 0x28);
                } while (ppVar55 != ppVar15);
                local_1a8.
                super__Vector_base<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = ppVar14;
              }
              if ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableHeader>
                   *)local_2d8._0_8_ != local_2c8) {
                operator_delete((void *)local_2d8._0_8_,
                                (ulong)(local_2c8[0].first._M_dataplus._M_p + 1));
              }
              sVar50 = (ppVar47->second)._M_string_length;
              lVar32 = 0;
              lVar46 = 0;
              uVar29 = uVar48;
            }
            std::
            vector<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::push_back(&local_1a8,ppVar47);
            lVar32 = lVar32 + sVar50;
            lVar46 = lVar46 + 1;
          }
          ppVar47 = ppVar47 + 1;
        } while (ppVar47 != local_108);
      }
    }
    if (local_170 != local_2e0) {
      pmVar4 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableCache_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableCache_*>_>_>
                *)(local_348._16_8_ + 0x2760);
      p_Var5 = (_Base_ptr)(local_348._16_8_ + 0x2768);
      lVar46 = sVar34 + (sVar34 == 0);
      lVar32 = 0;
      uVar48 = uVar29;
      do {
        cVar23 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableCache_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableCache_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableCache_*>_>_>
                 ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableCache_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableCache_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableCache_*>_>_>
                         *)pmVar4,
                        (key_type *)
                        ((long)&((local_1e8.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                        lVar32));
        if (cVar23._M_node == p_Var5) {
LAB_00106234:
          __assert_fail("cache.count(compactionFiles[i])",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/markcty[P]LSM-KV/kvstore.cpp"
                        ,0xf4,"void KVStore::compaction(int)");
        }
        ppSVar20 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableCache_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableCache_*>_>_>
                   ::at(pmVar4,(key_type *)
                               ((long)&((local_1e8.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                       _M_p + lVar32));
        pSVar7 = *ppSVar20;
        if (pSVar7 != (mapped_type)0x0) {
          pcVar33 = (pSVar7->fileName)._M_dataplus._M_p;
          paVar54 = &(pSVar7->fileName).field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar33 != paVar54) {
            operator_delete(pcVar33,paVar54->_M_allocated_capacity + 1);
          }
          ppVar8 = (pSVar7->index).
                   super__Vector_base<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if (ppVar8 != (pointer)0x0) {
            operator_delete(ppVar8,(long)(pSVar7->index).
                                         super__Vector_base<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                   (long)ppVar8);
          }
        }
        operator_delete(pSVar7,0x2858);
        pVar57 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableCache_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableCache_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableCache_*>_>_>
                 ::equal_range((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableCache_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableCache_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableCache_*>_>_>
                                *)pmVar4,
                               (key_type *)
                               ((long)&((local_1e8.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                       _M_p + lVar32));
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableCache_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableCache_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableCache_*>_>_>
        ::_M_erase_aux((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableCache_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableCache_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableCache_*>_>_>
                        *)pmVar4,(_Base_ptr)pVar57.first._M_node,(_Base_ptr)pVar57.second._M_node);
        lVar32 = lVar32 + 0x20;
        lVar46 = lVar46 + -1;
        uVar29 = uVar48;
      } while (lVar46 != 0);
    }
    if (local_1a8.
        super__Vector_base<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_1a8.
        super__Vector_base<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      ppVar42 = (pointer)local_348;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&stack0xfffffffffffffca8,local_228.first._M_dataplus._M_p,
                 local_228.first._M_dataplus._M_p + local_228.first._M_string_length);
      std::__cxx11::string::append(&stack0xfffffffffffffca8);
      uVar48 = *(int *)(local_348._16_8_ + 0x30);
      *(uint *)(local_348._16_8_ + 0x30) = uVar48 + 1;
      uVar51 = -uVar48;
      if (0 < (int)uVar48) {
        uVar51 = uVar48;
      }
      uVar49 = 1;
      if (9 < uVar51) {
        uVar26 = (ulong)uVar51;
        uVar24 = 4;
        do {
          uVar49 = uVar24;
          uVar18 = (uint)uVar26;
          if (uVar18 < 100) {
            uVar49 = uVar49 - 2;
            goto LAB_00105eda;
          }
          if (uVar18 < 1000) {
            uVar49 = uVar49 - 1;
            goto LAB_00105eda;
          }
          if (uVar18 < 10000) goto LAB_00105eda;
          uVar26 = uVar26 / 10000;
          uVar24 = uVar49 + 4;
        } while (99999 < uVar18);
        uVar49 = uVar49 + 1;
      }
LAB_00105eda:
      local_248 = local_238;
      std::__cxx11::string::_M_construct
                ((ulong)&local_248,(char)uVar49 - (char)((int)uVar48 >> 0x1f));
      std::__detail::__to_chars_10_impl<unsigned_int>
                ((char *)((ulong)(uVar48 >> 0x1f) + (long)local_248),uVar49,uVar51);
      ppVar40 = (pointer)((long)&(in_stack_fffffffffffffcb0->first)._M_dataplus._M_p + local_240);
      ppVar41 = (pointer)0xf;
      if (ppVar42 != (pointer)local_348) {
        ppVar41 = (pointer)local_348._0_8_;
      }
      if (ppVar41 < ppVar40) {
        ppVar41 = (pointer)0xf;
        if (local_248 != local_238) {
          ppVar41 = local_238[0];
        }
        if (ppVar41 < ppVar40) goto LAB_00105f63;
        puVar19 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)&local_248,0,(char *)0x0,(ulong)ppVar42);
        uVar48 = uVar29;
      }
      else {
LAB_00105f63:
        puVar19 = (undefined8 *)
                  std::__cxx11::string::_M_append(&stack0xfffffffffffffca8,(ulong)local_248);
        uVar48 = uVar29;
      }
      local_320._0_8_ = local_320 + 0x10;
      pcVar33 = (pointer)(puVar19 + 2);
      if ((pointer)*puVar19 == pcVar33) {
        local_320._16_8_ = *(undefined8 *)pcVar33;
        local_320._24_8_ = puVar19[3];
      }
      else {
        local_320._16_8_ = *(undefined8 *)pcVar33;
        local_320._0_8_ = (pointer)*puVar19;
      }
      local_320._8_8_ = puVar19[1];
      *puVar19 = pcVar33;
      puVar19[1] = 0;
      *pcVar33 = '\0';
      plVar21 = (long *)std::__cxx11::string::append(local_320);
      local_2d8._0_8_ = local_2c8;
      ppVar25 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableHeader>
                 *)(plVar21 + 2);
      if ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableHeader>
           *)*plVar21 == ppVar25) {
        local_2c8[0].first._M_dataplus._M_p = (ppVar25->first)._M_dataplus._M_p;
        local_2c8[0].first._M_string_length = plVar21[3];
      }
      else {
        local_2c8[0].first._M_dataplus._M_p = (ppVar25->first)._M_dataplus._M_p;
        local_2d8._0_8_ =
             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableHeader>
              *)*plVar21;
      }
      local_2d8._8_8_ = plVar21[1];
      *plVar21 = (long)ppVar25;
      plVar21[1] = 0;
      *(undefined1 *)(plVar21 + 2) = 0;
      if ((undefined1 *)local_320._0_8_ != local_320 + 0x10) {
        operator_delete((void *)local_320._0_8_,(ulong)(local_320._16_8_ + 1));
      }
      if (local_248 != local_238) {
        operator_delete(local_248,(ulong)((long)&(local_238[0]->first)._M_dataplus._M_p + 1));
      }
      if (ppVar42 != (pointer)local_348) {
        operator_delete(ppVar42,(ulong)(local_348._0_8_ + 1));
      }
      SSTable::toSSTable((SSTable *)&local_1a8,(SSTableDic *)local_2d8,(string *)local_348._24_8_,
                         (uint64_t)ppVar25);
      pSVar22 = (SSTableCache *)operator_new(0x2858);
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_d0,local_2d8._0_8_,
                 (pointer)(local_2d8._0_8_ +
                          (long)(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_2d8._8_8_));
      SSTableCache::SSTableCache(pSVar22,&local_1a8,local_348._24_8_,&local_d0);
      local_320._0_8_ = pSVar22;
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,SSTableCache*>,std::_Select1st<std::pair<std::__cxx11::string_const,SSTableCache*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,SSTableCache*>>>
      ::_M_emplace_unique<std::__cxx11::string&,SSTableCache*>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,SSTableCache*>,std::_Select1st<std::pair<std::__cxx11::string_const,SSTableCache*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,SSTableCache*>>>
                  *)(local_348._16_8_ + 0x2760),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d8,
                 (SSTableCache **)local_320);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
      if ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableHeader>
           *)local_2d8._0_8_ != local_2c8) {
        operator_delete((void *)local_2d8._0_8_,(ulong)(local_2c8[0].first._M_dataplus._M_p + 1));
      }
    }
    compaction((KVStore *)local_348._16_8_,uVar48);
    std::
    vector<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector(&local_1a8);
    std::
    vector<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector(&local_168);
    if (local_100.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_100.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_100.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_100.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    std::
    vector<std::vector<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
    ::~vector(&local_e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228.first._M_dataplus._M_p != &local_228.first.field_2) {
      operator_delete(local_228.first._M_dataplus._M_p,
                      (ulong)(local_228.first.field_2._M_allocated_capacity + 1));
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_1e8);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1c8);
LAB_001061f0:
  if (local_190 != &local_180) {
    operator_delete(local_190,local_180 + 1);
  }
  return;
}

Assistant:

void KVStore::compaction(int level) {
  string dir = storagePath + "/level-" + to_string(level);

  if (!utils::dirExists(dir)) return;

  vector<string> dirFiles;
  int maxFileNum = pow2(level + 1), fileNum = utils::scanDir(dir, dirFiles);
  if (fileNum <= maxFileNum) return;

  for (string &name : dirFiles) name.insert(0, dir + '/');

  // get the files which need compaction
  vector<string> compactionFiles;
  if (level == 0) {
    compactionFiles = dirFiles;
  } else {
    // find the files with smallest timeStamp
    using nameHeader = pair<string, SSTableHeader>;
    auto cmp = [](const nameHeader &left, const nameHeader &right) {
      const auto &lHeader = left.second;
      const auto &rHeader = right.second;
      return (lHeader.timeStamp > rHeader.timeStamp ||
              (lHeader.timeStamp == rHeader.timeStamp &&
               lHeader.minKey > rHeader.minKey));
    };
    priority_queue<nameHeader, vector<nameHeader>, decltype(cmp)> q(cmp);
    int k = fileNum - maxFileNum;
    for (const auto &file : dirFiles)
      q.emplace(file, cache.at(file)->getHeader());
    while (k--) {
      auto top = q.top();
      q.pop();
      compactionFiles.push_back(top.first);
    }
  }

  // prepare minKey, maxKey, maxTimeStamp for overlap detection
  uint64_t minKey = UINT64_MAX, maxKey = 0, maxTimeStamp = 0;
  for (const auto &file : compactionFiles) {
    const auto &header = cache.at(file)->getHeader();
    maxKey = max(header.maxKey, maxKey);
    minKey = min(header.minKey, minKey);
    maxTimeStamp = max(header.timeStamp, maxTimeStamp);
  }

  // get SSTables in next level whose keys intersects with compaction Files
  string nextDir = storagePath + "/level-" + to_string(level + 1);
  if (!utils::dirExists(nextDir)) utils::mkdir(nextDir.c_str());
  dirFiles.clear();
  utils::scanDir(nextDir, dirFiles);
  for (string &name : dirFiles) name.insert(0, nextDir + '/');
  for (const auto &file : dirFiles) {
    const auto &header = cache.at(file)->getHeader();
    if ((minKey <= header.minKey && header.minKey <= maxKey) ||
        (minKey <= header.maxKey && header.maxKey <= maxKey)) {
      compactionFiles.push_back(file);
      maxTimeStamp = max(maxTimeStamp, header.timeStamp);
    }
  }

  const auto k = compactionFiles.size();
  unsigned long pairNum = 0;

  // check if it is the last level
  bool lastLevel = false;
  if (!utils::dirExists(storagePath + "/level-" + to_string(level + 2)))
    lastLevel = true;

  // read dictionaries from dics
  vector<SSTableDic> dics(compactionFiles.size());
  for (uint64_t i = 0; i < k; i++) {
    // read dic
    SSTable::readDic(compactionFiles[i], dics[i]);
    utils::rmfile(compactionFiles[i].c_str());
    pairNum += dics[i].size();
  }

  // merge the dics, convert to SSTables
  vector<uint64_t> indices(k);
  SSTableDic mergedDic;
  uint64_t lastTimeStamp = 0;
  while (pairNum--) {
    // find the next pair to merge
    minKey = UINT64_MAX;
    auto minDic = 0;
    for (uint64_t i = 0; i < k; i++) {
      if (indices[i] < dics[i].size() &&
          dics[i].at(indices[i]).first < minKey) {
        minKey = dics[i].at(indices[i]).first;
        minDic = i;
      }
    }
    const auto &pair = dics[minDic].at(indices[minDic]++);

    const auto &header = cache.at(compactionFiles[minDic])->getHeader();

    // duplicate keys, select the one with the largest timeStamp
    if (!mergedDic.empty() && pair.first == mergedDic.back().first) {
      if (header.timeStamp < lastTimeStamp)
        continue;
      else
        mergedDic.pop_back();
    }

    mergedDic.emplace_back(pair.first, pair.second);
    lastTimeStamp = header.timeStamp;
  }

  // split to SSTable
  SSTableDic t;  // TODO: can be optimized out
  uint64_t valueSize = 0, length = 0;
  for (const auto &pair : mergedDic) {
    // last level should not contain deleted value
    if (lastLevel && pair.second == "~DELETED~") continue;

    if (overflow(length + 1, valueSize + pair.second.size())) {
      auto fileName = nextDir + "/" + to_string(fileNums++) + ".sst";
      SSTable::toSSTable(t, fileName, maxTimeStamp);
      cache.emplace(fileName, new SSTableCache(t, maxTimeStamp, fileName));
      valueSize = 0;
      length = 0;
      t.clear();
    }

    length++;
    valueSize += pair.second.size();
    t.push_back(pair);
  }

  // delete cache
  for (uint64_t i = 0; i < k; i++) {
    // delete cache
    assert(cache.count(compactionFiles[i]));
    auto c = cache.at(compactionFiles[i]);
    delete c;
    cache.erase(compactionFiles[i]);
  }

  // convert the remaining key value pairs to a SSTable
  if (!t.empty()) {
    auto fileName = nextDir + "/" + to_string(fileNums++) + ".sst";
    SSTable::toSSTable(t, fileName, maxTimeStamp);
    cache.emplace(fileName, new SSTableCache(t, maxTimeStamp, fileName));
  }

  // compact next level
  compaction(level + 1);
}